

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

UObject * __thiscall
icu_63::DefaultCalendarFactory::create
          (DefaultCalendarFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  ECalType EVar1;
  UnicodeString *this_00;
  undefined4 srcLength;
  Locale *this_01;
  Locale loc;
  ConstChar16Ptr local_150;
  char16_t *local_148;
  UnicodeString local_138;
  Locale local_f8;
  
  this_01 = &local_f8;
  Locale::Locale(this_01);
  (*(key->super_UObject)._vptr_UObject[0xc])(key);
  this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)this_01);
  if (this_00 == (UnicodeString *)0x0) {
    this_00 = (UnicodeString *)0x0;
  }
  else {
    (this_00->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00401be0;
    (this_00->fUnion).fStackFields.fLengthAndFlags = 2;
  }
  if (this_00 == (UnicodeString *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    local_138.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x40;
    UnicodeString::doAppend(this_00,(UChar *)&local_138,0,1);
    local_150.p_ = L"calendar=";
    UnicodeString::UnicodeString(&local_138,'\x01',&local_150,9);
    srcLength = local_138.fUnion.fFields.fLength;
    if (-1 < local_138.fUnion.fStackFields.fLengthAndFlags) {
      srcLength = (int)local_138.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(this_00,&local_138,0,srcLength);
    UnicodeString::~UnicodeString(&local_138);
    local_148 = local_150.p_;
    EVar1 = getCalendarTypeForLocale(local_f8.fullName);
    UnicodeString::UnicodeString(&local_138,gCalTypes[EVar1],-1,kInvariant);
    if (-1 < local_138.fUnion.fStackFields.fLengthAndFlags) {
      local_138.fUnion.fFields.fLength = (int)local_138.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(this_00,&local_138,0,local_138.fUnion.fFields.fLength);
    UnicodeString::~UnicodeString(&local_138);
  }
  Locale::~Locale(&local_f8);
  return (UObject *)this_00;
}

Assistant:

virtual UObject* create(const ICUServiceKey& key, const ICUService* /*service*/, UErrorCode& status) const  {

        LocaleKey &lkey = (LocaleKey&)key;
        Locale loc;
        lkey.currentLocale(loc);

        UnicodeString *ret = new UnicodeString();
        if (ret == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            ret->append((UChar)0x40); // '@' is a variant character
            ret->append(UNICODE_STRING("calendar=", 9));
            ret->append(UnicodeString(gCalTypes[getCalendarTypeForLocale(loc.getName())], -1, US_INV));
        }
        return ret;
    }